

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmCommonTargetGenerator::GetCompilerLauncher
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *lang,string *config)

{
  bool bVar1;
  string *psVar2;
  cmLocalGenerator *lg;
  string evaluatedClauncher;
  string local_60;
  string clauncher_prop;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = std::operator==(lang,"C");
  if (((((!bVar1) && (bVar1 = std::operator==(lang,"CXX"), !bVar1)) &&
       (bVar1 = std::operator==(lang,"Fortran"), !bVar1)) &&
      ((bVar1 = std::operator==(lang,"CUDA"), !bVar1 &&
       (bVar1 = std::operator==(lang,"HIP"), !bVar1)))) &&
     ((bVar1 = std::operator==(lang,"ISPC"), !bVar1 &&
      ((bVar1 = std::operator==(lang,"OBJC"), !bVar1 &&
       (bVar1 = std::operator==(lang,"OBJCXX"), !bVar1)))))) {
    return __return_storage_ptr__;
  }
  cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
            (&clauncher_prop,lang,(char (*) [19])0x6d340d);
  psVar2 = (string *)cmGeneratorTarget::GetProperty(this->GeneratorTarget,&clauncher_prop);
  if (psVar2 == (string *)0x0) {
    psVar2 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_60,(string *)psVar2);
  lg = cmGeneratorTarget::GetLocalGenerator(this->GeneratorTarget);
  cmGeneratorExpression::Evaluate
            (&evaluatedClauncher,&local_60,lg,config,this->GeneratorTarget,
             (cmGeneratorExpressionDAGChecker *)0x0,this->GeneratorTarget,lang);
  std::__cxx11::string::~string((string *)&local_60);
  if (evaluatedClauncher._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&evaluatedClauncher);
  std::__cxx11::string::~string((string *)&clauncher_prop);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetCompilerLauncher(
  std::string const& lang, std::string const& config)
{
  std::string compilerLauncher;
  if (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA" ||
      lang == "HIP" || lang == "ISPC" || lang == "OBJC" || lang == "OBJCXX") {
    std::string const clauncher_prop = cmStrCat(lang, "_COMPILER_LAUNCHER");
    cmValue clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    std::string const evaluatedClauncher = cmGeneratorExpression::Evaluate(
      *clauncher, this->GeneratorTarget->GetLocalGenerator(), config,
      this->GeneratorTarget, nullptr, this->GeneratorTarget, lang);
    if (!evaluatedClauncher.empty()) {
      compilerLauncher = evaluatedClauncher;
    }
  }
  return compilerLauncher;
}